

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase181::run(TestCase181 *this)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  char *pcVar3;
  size_t sVar4;
  TransformPromiseNodeBase *this_00;
  Disposer *pDVar5;
  Disposer *pDVar6;
  int iVar7;
  Own<kj::_::ChainPromiseNode> OVar8;
  Promise<void> promise;
  uint lines;
  String trace;
  EventLoop loop;
  PromiseBase local_b8;
  Own<kj::_::PromiseNode> local_a8;
  String local_98;
  Own<kj::_::PromiseNode> local_78;
  EventLoop local_68;
  
  EventLoop::EventLoop(&local_68);
  EventLoop::enterScope(&local_68);
  _::neverDone();
  local_b8.node.disposer = (Disposer *)local_98.content.ptr;
  local_b8.node.ptr = (PromiseNode *)local_98.content.size_;
  iVar7 = 1000;
  do {
    pPVar1 = local_b8.node.ptr;
    pDVar6 = local_b8.node.disposer;
    local_b8.node.ptr = (PromiseNode *)0x0;
    _::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_78,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:189:44),_kj::Promise<void>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00451740;
    this_00[1].dependency.disposer = pDVar6;
    this_00[1].dependency.ptr = pPVar1;
    local_a8.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::TestCase181::run()::$_0,kj::Promise<void>>,kj::_::PropagateException>>
          ::instance;
    local_a8.ptr = (PromiseNode *)this_00;
    OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_98,&local_a8);
    sVar4 = local_98.content.size_;
    pcVar3 = local_98.content.ptr;
    pPVar1 = local_a8.ptr;
    if ((TransformPromiseNodeBase *)local_a8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_a8.ptr = (PromiseNode *)0x0;
      (**(local_a8.disposer)->_vptr_Disposer)
                (local_a8.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar8.ptr);
    }
    pPVar1 = local_78.ptr;
    if (local_78.ptr != (PromiseNode *)0x0) {
      local_78.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_))
                ((undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_),
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    }
    pPVar1 = local_b8.node.ptr;
    pDVar6 = local_b8.node.disposer;
    local_b8.node.disposer = (Disposer *)pcVar3;
    local_b8.node.ptr = (PromiseNode *)sVar4;
    if (pPVar1 != (PromiseNode *)0x0) {
      (**pDVar6->_vptr_Disposer)
                (pDVar6,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  EventLoop::run(&local_68,0xffffffff);
  _::PromiseBase::trace(&local_98,&local_b8);
  pDVar6 = (Disposer *)
           ((undefined1 *)
            ((long)&((Disposer *)((long)local_98.content.ptr + -8))->_vptr_Disposer + 7) +
           local_98.content.size_);
  pDVar5 = (Disposer *)local_98.content.ptr;
  if ((PromiseNode *)local_98.content.size_ == (PromiseNode *)0x0) {
    pDVar5 = (Disposer *)0x0;
  }
  local_a8.disposer = (Disposer *)((ulong)local_a8.disposer & 0xffffffff00000000);
  pDVar2 = local_a8.disposer;
  if ((PromiseNode *)local_98.content.size_ == (PromiseNode *)0x0) {
    pDVar6 = (Disposer *)0x0;
  }
  if (pDVar5 != pDVar6) {
    local_a8.disposer._0_4_ = 0;
    iVar7 = (uint)local_a8.disposer;
    local_a8.disposer = pDVar2;
    do {
      iVar7 = iVar7 + (uint)(*(char *)&pDVar5->_vptr_Disposer == '\n');
      local_a8.disposer = (Disposer *)CONCAT44(local_a8.disposer._4_4_,iVar7);
      pDVar5 = (Disposer *)((long)&pDVar5->_vptr_Disposer + 1);
    } while (pDVar5 != pDVar6);
  }
  if ((4 < (uint)local_a8.disposer) && (_::Debug::minSeverity < 3)) {
    local_78.disposer._0_4_ = 5;
    _::Debug::log<char_const(&)[31],unsigned_int&,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0xcc,ERROR,"\"failed: expected \" \"(lines) < (5)\", lines, 5",
               (char (*) [31])"failed: expected (lines) < (5)",(uint *)&local_a8,(int *)&local_78);
  }
  sVar4 = local_98.content.size_;
  pcVar3 = local_98.content.ptr;
  if ((Disposer *)local_98.content.ptr != (Disposer *)0x0) {
    local_98.content.ptr = (char *)0x0;
    local_98.content.size_ = 0;
    (**(local_98.content.disposer)->_vptr_ArrayDisposer)
              (local_98.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  pPVar1 = local_b8.node.ptr;
  if (local_b8.node.ptr != (PromiseNode *)0x0) {
    local_b8.node.ptr = (PromiseNode *)0x0;
    (**(local_b8.node.disposer)->_vptr_Disposer)
              (local_b8.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(&local_68);
  EventLoop::~EventLoop(&local_68);
  return;
}

Assistant:

TEST(Async, DeepChain) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = NEVER_DONE;

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  loop.run();

  auto trace = promise.trace();
  uint lines = 0;
  for (char c: trace) {
    lines += c == '\n';
  }

  // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
  // 2-ish nodes.  We'll give a little room for implementation freedom.
  EXPECT_LT(lines, 5);
}